

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_sll_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t fVar1;
  undefined1 auVar2 [16];
  char cVar3;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  undefined1 auVar4 [16];
  char cVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  fVar1 = (env->active_fpu).fpr[ws];
  auVar4 = psllw((undefined1  [16])(env->active_fpu).fpr[wt],5);
  auVar4 = auVar4 & _DAT_00b902b0;
  cVar3 = auVar4[0];
  auVar20[0] = -(cVar3 < '\0');
  cVar5 = auVar4[1];
  auVar20[1] = -(cVar5 < '\0');
  cVar6 = auVar4[2];
  auVar20[2] = -(cVar6 < '\0');
  cVar7 = auVar4[3];
  auVar20[3] = -(cVar7 < '\0');
  cVar8 = auVar4[4];
  auVar20[4] = -(cVar8 < '\0');
  cVar9 = auVar4[5];
  auVar20[5] = -(cVar9 < '\0');
  cVar10 = auVar4[6];
  auVar20[6] = -(cVar10 < '\0');
  cVar11 = auVar4[7];
  auVar20[7] = -(cVar11 < '\0');
  cVar12 = auVar4[8];
  auVar20[8] = -(cVar12 < '\0');
  cVar13 = auVar4[9];
  auVar20[9] = -(cVar13 < '\0');
  cVar14 = auVar4[10];
  auVar20[10] = -(cVar14 < '\0');
  cVar15 = auVar4[0xb];
  auVar20[0xb] = -(cVar15 < '\0');
  cVar16 = auVar4[0xc];
  auVar20[0xc] = -(cVar16 < '\0');
  cVar17 = auVar4[0xd];
  auVar20[0xd] = -(cVar17 < '\0');
  cVar18 = auVar4[0xe];
  auVar20[0xe] = -(cVar18 < '\0');
  cVar19 = auVar4[0xf];
  auVar20[0xf] = -(cVar19 < '\0');
  auVar4 = psllw((undefined1  [16])fVar1,4);
  auVar4 = auVar4 & auVar20 & _DAT_00b903d0 | ~auVar20 & (undefined1  [16])fVar1;
  auVar22[0] = -((char)(cVar3 * '\x02') < '\0');
  auVar22[1] = -((char)(cVar5 * '\x02') < '\0');
  auVar22[2] = -((char)(cVar6 * '\x02') < '\0');
  auVar22[3] = -((char)(cVar7 * '\x02') < '\0');
  auVar22[4] = -((char)(cVar8 * '\x02') < '\0');
  auVar22[5] = -((char)(cVar9 * '\x02') < '\0');
  auVar22[6] = -((char)(cVar10 * '\x02') < '\0');
  auVar22[7] = -((char)(cVar11 * '\x02') < '\0');
  auVar22[8] = -((char)(cVar12 * '\x02') < '\0');
  auVar22[9] = -((char)(cVar13 * '\x02') < '\0');
  auVar22[10] = -((char)(cVar14 * '\x02') < '\0');
  auVar22[0xb] = -((char)(cVar15 * '\x02') < '\0');
  auVar22[0xc] = -((char)(cVar16 * '\x02') < '\0');
  auVar22[0xd] = -((char)(cVar17 * '\x02') < '\0');
  auVar22[0xe] = -((char)(cVar18 * '\x02') < '\0');
  auVar22[0xf] = -((char)(cVar19 * '\x02') < '\0');
  auVar2 = psllw(auVar4,2);
  auVar4 = auVar2 & auVar22 & _DAT_00b902d0 | ~auVar22 & auVar4;
  auVar21[0] = -((char)(cVar3 << 2) < '\0');
  auVar21[1] = -((char)(cVar5 << 2) < '\0');
  auVar21[2] = -((char)(cVar6 << 2) < '\0');
  auVar21[3] = -((char)(cVar7 << 2) < '\0');
  auVar21[4] = -((char)(cVar8 << 2) < '\0');
  auVar21[5] = -((char)(cVar9 << 2) < '\0');
  auVar21[6] = -((char)(cVar10 << 2) < '\0');
  auVar21[7] = -((char)(cVar11 << 2) < '\0');
  auVar21[8] = -((char)(cVar12 << 2) < '\0');
  auVar21[9] = -((char)(cVar13 << 2) < '\0');
  auVar21[10] = -((char)(cVar14 << 2) < '\0');
  auVar21[0xb] = -((char)(cVar15 << 2) < '\0');
  auVar21[0xc] = -((char)(cVar16 << 2) < '\0');
  auVar21[0xd] = -((char)(cVar17 << 2) < '\0');
  auVar21[0xe] = -((char)(cVar18 << 2) < '\0');
  auVar21[0xf] = -((char)(cVar19 << 2) < '\0');
  auVar2[1] = auVar4[1] * '\x02';
  auVar2[0] = auVar4[0] * '\x02';
  auVar2[2] = auVar4[2] * '\x02';
  auVar2[3] = auVar4[3] * '\x02';
  auVar2[4] = auVar4[4] * '\x02';
  auVar2[5] = auVar4[5] * '\x02';
  auVar2[6] = auVar4[6] * '\x02';
  auVar2[7] = auVar4[7] * '\x02';
  auVar2[8] = auVar4[8] * '\x02';
  auVar2[9] = auVar4[9] * '\x02';
  auVar2[10] = auVar4[10] * '\x02';
  auVar2[0xb] = auVar4[0xb] * '\x02';
  auVar2[0xc] = auVar4[0xc] * '\x02';
  auVar2[0xd] = auVar4[0xd] * '\x02';
  auVar2[0xe] = auVar4[0xe] * '\x02';
  auVar2[0xf] = auVar4[0xf] * '\x02';
  (env->active_fpu).fpr[wd] = (fpr_t)(auVar2 & auVar21 | ~auVar21 & auVar4);
  return;
}

Assistant:

void helper_msa_sll_b(CPUMIPSState *env,
                      uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_sll_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_sll_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_sll_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_sll_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_sll_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_sll_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_sll_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_sll_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_sll_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_sll_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_sll_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_sll_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_sll_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_sll_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_sll_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_sll_df(DF_BYTE, pws->b[15], pwt->b[15]);
}